

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_alsa.c
# Opt level: O0

int alsa_run(cubeb_conflict1 *ctx)

{
  int iVar1;
  long in_RDI;
  stream_state state;
  cubeb_stream_conflict1 *stm;
  char dummy;
  int i;
  int timeout;
  int r;
  cubeb_stream_conflict1 *in_stack_00000088;
  stream_state state_00;
  long lVar2;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  int iVar3;
  int local_18;
  
  pthread_mutex_lock((pthread_mutex_t *)(in_RDI + 0x18));
  if (*(int *)(in_RDI + 0xd0) != 0) {
    rebuild((cubeb_conflict1 *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
  }
  local_18 = 1000;
  for (iVar3 = 0; iVar3 < 0x10; iVar3 = iVar3 + 1) {
    lVar2 = *(long *)(in_RDI + 0x40 + (long)iVar3 * 8);
    if ((((lVar2 != 0) && (*(int *)(lVar2 + 0xb0) == 2)) &&
        (iVar1 = ms_until((timeval *)0x10e7c1), -1 < iVar1)) && (iVar1 < local_18)) {
      local_18 = iVar1;
    }
  }
  pthread_mutex_unlock((pthread_mutex_t *)(in_RDI + 0x18));
  iVar3 = poll(*(pollfd **)(in_RDI + 0xc0),*(nfds_t *)(in_RDI + 200),local_18);
  pthread_mutex_lock((pthread_mutex_t *)(in_RDI + 0x18));
  if (iVar3 < 1) {
    if (iVar3 == 0) {
      for (iVar3 = 0; iVar3 < 0x10; iVar3 = iVar3 + 1) {
        lVar2 = *(long *)(in_RDI + 0x40 + (long)iVar3 * 8);
        if (lVar2 != 0) {
          if ((*(int *)(lVar2 + 0xb0) == 2) && (iVar1 = ms_since((timeval *)0x10e9cd), -1 < iVar1))
          {
            alsa_set_stream_state
                      ((cubeb_stream_conflict1 *)CONCAT44(iVar3,in_stack_ffffffffffffffe0),
                       (stream_state)((ulong)lVar2 >> 0x20));
            (**(code **)(lVar2 + 0x48))(lVar2,*(undefined8 *)(lVar2 + 8),2);
          }
          else if ((*(int *)(lVar2 + 0xb0) == 1) &&
                  (iVar1 = ms_since((timeval *)0x10ea1d), 10000 < iVar1)) {
            alsa_set_stream_state
                      ((cubeb_stream_conflict1 *)CONCAT44(iVar3,in_stack_ffffffffffffffe0),
                       (stream_state)((ulong)lVar2 >> 0x20));
            (**(code **)(lVar2 + 0x48))(lVar2,*(undefined8 *)(lVar2 + 8),3);
          }
        }
      }
    }
  }
  else {
    if (((*(ushort *)(*(long *)(in_RDI + 0xc0) + 6) & 1) != 0) &&
       (read(*(int *)(in_RDI + 0xd8),&stack0xffffffffffffffe3,1), *(int *)(in_RDI + 0xd4) != 0)) {
      pthread_mutex_unlock((pthread_mutex_t *)(in_RDI + 0x18));
      return -1;
    }
    for (iVar3 = 0; iVar3 < 0x10; iVar3 = iVar3 + 1) {
      lVar2 = *(long *)(in_RDI + 0x40 + (long)iVar3 * 8);
      if (((lVar2 != 0) && (*(int *)(lVar2 + 0xb0) == 1)) && (*(long *)(lVar2 + 0xc0) != 0)) {
        iVar1 = any_revents(*(pollfd **)(lVar2 + 0xc0),*(nfds_t *)(lVar2 + 200));
        state_00 = (stream_state)((ulong)lVar2 >> 0x20);
        if (iVar1 != 0) {
          alsa_set_stream_state
                    ((cubeb_stream_conflict1 *)CONCAT44(iVar3,in_stack_ffffffffffffffe0),state_00);
          pthread_mutex_unlock((pthread_mutex_t *)(in_RDI + 0x18));
          alsa_process_stream(in_stack_00000088);
          pthread_mutex_lock((pthread_mutex_t *)(in_RDI + 0x18));
          alsa_set_stream_state
                    ((cubeb_stream_conflict1 *)CONCAT44(iVar3,in_stack_ffffffffffffffe0),state_00);
        }
      }
    }
  }
  pthread_mutex_unlock((pthread_mutex_t *)(in_RDI + 0x18));
  return 0;
}

Assistant:

static int
alsa_run(cubeb * ctx)
{
  int r;
  int timeout;
  int i;
  char dummy;
  cubeb_stream * stm;
  enum stream_state state;

  pthread_mutex_lock(&ctx->mutex);

  if (ctx->rebuild) {
    rebuild(ctx);
  }

  /* Wake up at least once per second for the watchdog. */
  timeout = 1000;
  for (i = 0; i < CUBEB_STREAM_MAX; ++i) {
    stm = ctx->streams[i];
    if (stm && stm->state == DRAINING) {
      r = ms_until(&stm->drain_timeout);
      if (r >= 0 && timeout > r) {
        timeout = r;
      }
    }
  }

  pthread_mutex_unlock(&ctx->mutex);
  r = poll(ctx->fds, ctx->nfds, timeout);
  pthread_mutex_lock(&ctx->mutex);

  if (r > 0) {
    if (ctx->fds[0].revents & POLLIN) {
      if (read(ctx->control_fd_read, &dummy, 1) < 0) {
        /* ignore read error */
      }

      if (ctx->shutdown) {
        pthread_mutex_unlock(&ctx->mutex);
        return -1;
      }
    }

    for (i = 0; i < CUBEB_STREAM_MAX; ++i) {
      stm = ctx->streams[i];
      /* We can't use snd_pcm_poll_descriptors_revents here because of
         https://github.com/kinetiknz/cubeb/issues/135. */
      if (stm && stm->state == RUNNING && stm->fds && any_revents(stm->fds, stm->nfds)) {
        alsa_set_stream_state(stm, PROCESSING);
        pthread_mutex_unlock(&ctx->mutex);
        state = alsa_process_stream(stm);
        pthread_mutex_lock(&ctx->mutex);
        alsa_set_stream_state(stm, state);
      }
    }
  } else if (r == 0) {
    for (i = 0; i < CUBEB_STREAM_MAX; ++i) {
      stm = ctx->streams[i];
      if (stm) {
        if (stm->state == DRAINING && ms_since(&stm->drain_timeout) >= 0) {
          alsa_set_stream_state(stm, INACTIVE);
          stm->state_callback(stm, stm->user_ptr, CUBEB_STATE_DRAINED);
        } else if (stm->state == RUNNING && ms_since(&stm->last_activity) > CUBEB_WATCHDOG_MS) {
          alsa_set_stream_state(stm, ERROR);
          stm->state_callback(stm, stm->user_ptr, CUBEB_STATE_ERROR);
        }
      }
    }
  }

  pthread_mutex_unlock(&ctx->mutex);

  return 0;
}